

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::Check<short,4,false,3u>
          (StorageAndSubImageTest *this)

{
  short sVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLshort *pGVar6;
  ulong uVar7;
  allocator_type local_21;
  vector<short,_std::allocator<short>_> result;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  std::vector<short,_std::allocator<short>_>::vector(&result,0x60,&local_21);
  (**(code **)(lVar5 + 0xff0))(0xcf5,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8e5);
  (**(code **)(lVar5 + 0xff0))(0xd05,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8e8);
  (**(code **)(lVar5 + 0x1228))(0,0,0x18,1,0x8d99,0x1402,0xc0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8fd);
  pGVar6 = Reference::ReferenceData<short,_false>::reference;
  uVar2 = 0;
  do {
    uVar7 = uVar2;
    if (uVar7 == 0x60) break;
    sVar1 = *pGVar6;
    pGVar6 = pGVar6 + 1;
    uVar2 = uVar7 + 1;
  } while (result.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar7] == sVar1);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&result.super__Vector_base<short,_std::allocator<short>_>);
  return 0x5f < uVar7;
}

Assistant:

bool StorageAndSubImageTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching data. */
	std::vector<T> result(TestReferenceDataCount<S, D>());

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	glw::GLuint fbo_size_x = 0;

	switch (D)
	{
	case 1:
		fbo_size_x = 2;
		break;
	case 2:
		fbo_size_x = 2 * 3;
		break;
	case 3:
		fbo_size_x = 2 * 3 * 4;
		break;
	default:
		throw 0;
	}

	gl.readnPixels(0, 0, fbo_size_x, 1, Format<S, N>(), Type<T>(), TestReferenceDataSize<T, S, D>(),
				   (glw::GLvoid*)(&result[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < TestReferenceDataCount<S, D>(); ++i)
	{
		if (!Compare<T>(result[i], ReferenceData<T, N>()[i]))
		{
			return false;
		}
	}

	return true;
}